

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

wchar_t archive_entry_update_link_utf8(archive_entry *entry,char *target)

{
  int *piVar1;
  char *in_RSI;
  long in_RDI;
  wchar_t r;
  archive_mstring *in_stack_00000020;
  archive *in_stack_00000028;
  undefined4 local_1c;
  int retvalue;
  undefined4 local_4;
  
  if ((*(uint *)(in_RDI + 0xc0) & 2) == 0) {
    local_1c = archive_mstring_update_utf8(in_stack_00000028,in_stack_00000020,(char *)entry);
    retvalue = (int)((ulong)in_RDI >> 0x20);
  }
  else {
    local_1c = archive_mstring_update_utf8(in_stack_00000028,in_stack_00000020,(char *)entry);
    retvalue = (int)((ulong)in_RDI >> 0x20);
  }
  if (local_1c == L'\0') {
    local_4 = L'\x01';
  }
  else {
    piVar1 = __errno_location();
    if (*piVar1 == 0xc) {
      __archive_errx(retvalue,in_RSI);
    }
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

int
archive_entry_update_link_utf8(struct archive_entry *entry, const char *target)
{
	int r;
	if (entry->ae_set & AE_SET_SYMLINK)
		r = archive_mstring_update_utf8(entry->archive,
		    &entry->ae_symlink, target);
	else
		r = archive_mstring_update_utf8(entry->archive,
		    &entry->ae_hardlink, target);
	if (r == 0)
		return (1);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (0);
}